

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpCommsSS.cpp
# Opt level: O1

void __thiscall helics::tcp::TcpCommsSS::queue_tx_function(TcpCommsSS *this)

{
  _Atomic_word *p_Var1;
  io_context *piVar2;
  TcpConnection *pTVar3;
  uint __val;
  undefined4 uVar4;
  undefined8 uVar5;
  element_type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  __native_type *this_01;
  pointer ppVar7;
  BaseType BVar8;
  uint uVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  int *piVar13;
  mapped_type *pmVar14;
  __native_type *p_Var15;
  char *pcVar16;
  iterator iVar17;
  mapped_type *__args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar18;
  _Base_ptr p_Var19;
  __native_type *p_Var20;
  uint uVar21;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  ActionMessage *command;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *pvVar22;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>
  *rt;
  bool bVar23;
  int __fd;
  ulong uVar24;
  const_iterator __first;
  undefined8 uVar25;
  __native_type *p_Var26;
  __native_type *in_R8;
  _Rb_tree_header *p_Var28;
  uint __len;
  size_type __rlen;
  bool bVar29;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view message_04;
  string_view message_05;
  string_view message_06;
  string_view message_07;
  pair<std::_Rb_tree_iterator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_std::_Rb_tree_iterator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  pVar30;
  pointer new_connect_1;
  pointer new_connect;
  map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  routes;
  shared_ptr<gmlc::networking::AsioContextManager> ioctx;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  made_connections;
  LoopHandle contextLoop;
  string cstring;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
  established_routes;
  ActionMessage cmessage;
  action_t in_stack_fffffffffffffadc;
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [32];
  __native_type *local_4d0;
  undefined1 local_4c8 [16];
  __native_type local_4b8 [5];
  shared_ptr<gmlc::networking::TcpConnection> local_3e8;
  BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
  *local_3d0;
  undefined1 local_3a8 [32];
  __native_type *local_388;
  _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  local_380;
  __native_type *local_350;
  undefined1 local_348 [16];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  local_338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  _Head_base<0UL,_asio::io_context_*,_false> local_308;
  _Head_base<0UL,_asio::io_context::work_*,_false> local_300;
  long lStack_2f8;
  undefined1 local_2f0 [40];
  undefined8 uStack_2c8;
  element_type *local_2c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  __native_type *p_Stack_298;
  undefined8 local_290;
  __native_type *local_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined1 local_258 [24];
  undefined1 local_240 [16];
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_230;
  code *local_228;
  _Alloc_hider _Stack_220;
  undefined1 local_218 [16];
  code *local_208;
  _Head_base<0UL,_asio::io_context_*,_false> _Stack_200;
  _Any_data local_1f8;
  code *local_1e8;
  code *pcStack_1e0;
  _Any_data local_1d8;
  code *local_1c8;
  code *pcStack_1c0;
  undefined1 local_1b8 [32];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
  local_198;
  _Any_data local_168;
  code *local_158;
  code *pcStack_150;
  _Any_data local_148;
  code *local_138;
  code *pcStack_130;
  _Any_data local_128;
  code *local_118;
  code *pcStack_110;
  _Any_data local_108;
  code *local_f8;
  code *pcStack_f0;
  ActionMessage local_e8;
  timespec *ptVar27;
  
  if (((this->super_NetworkCommsInterface).super_CommsInterface.serverMode == true) &&
     ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 0)) {
    iVar11 = getDefaultPort(0xb);
    LOCK();
    (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i = iVar11;
    UNLOCK();
  }
  if (((this->super_NetworkCommsInterface).super_CommsInterface.serverMode == false) &&
     (this->outgoingConnectionsAllowed == false)) {
    message_01._M_str = "no server and no outgoing connections-> no way to connect to comms";
    message_01._M_len = 0x42;
    CommsInterface::logError((CommsInterface *)this,message_01);
    CommsInterface::setRxStatus((CommsInterface *)this,ERRORED);
    CommsInterface::setTxStatus((CommsInterface *)this,ERRORED);
    return;
  }
  local_4c8._8_8_ = (__native_type *)0x0;
  local_4b8[0].__align = local_4b8[0].__align & 0xffffffffffffff00;
  local_4c8._0_8_ = local_4b8;
  gmlc::networking::AsioContextManager::getContextPointer
            ((AsioContextManager *)local_348,(string *)local_4c8);
  if ((__native_type *)local_4c8._0_8_ != local_4b8) {
    operator_delete((void *)local_4c8._0_8_,(ulong)(local_4b8[0].__align + 1));
  }
  if ((this->super_NetworkCommsInterface).encrypted == true) {
    gmlc::networking::SocketFactory::SocketFactory
              ((SocketFactory *)local_258,&this->encryption_config,true);
  }
  else {
    local_258._0_8_ = (element_type *)0x0;
    local_258._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_258[0x10] = false;
    local_258[0x11] = false;
    local_258._18_6_ = 0;
  }
  gmlc::networking::AsioContextManager::startContextLoop((AsioContextManager *)local_240);
  if ((this->super_NetworkCommsInterface).super_CommsInterface.serverMode == true) {
    uVar12 = (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i;
    in_R8 = (__native_type *)(ulong)(uVar12 & 0xffff);
    gmlc::networking::TcpServer::create
              ((TcpServer *)local_4c8,(SocketFactory *)local_258,
               *(io_context **)(local_348._0_8_ + 0x40),
               &(this->super_NetworkCommsInterface).super_CommsInterface.localTargetAddress,
               (uint16_t)uVar12,true,
               (this->super_NetworkCommsInterface).super_CommsInterface.maxMessageSize);
    local_4d0 = (__native_type *)local_4c8._8_8_;
    p_Var20 = (__native_type *)local_4c8._0_8_;
    local_4c8._8_8_ = (__native_type *)0x0;
    local_4c8._0_8_ = (__native_type *)0x0;
    if ((*(byte *)((long)p_Var20->__size + 0xf0) & 1) != 0) {
      do {
        message._M_str = "retrying tcp bind";
        message._M_len = 0x11;
        CommsInterface::logWarning((CommsInterface *)this,message);
        local_4c8._0_8_ = (__native_type *)0x0;
        local_4c8._8_8_ = (__native_type *)0x8f0d180;
        do {
          iVar11 = nanosleep((timespec *)local_4c8,(timespec *)local_4c8);
          if (iVar11 != -1) break;
          piVar13 = __errno_location();
        } while (*piVar13 == 4);
        bVar10 = gmlc::networking::TcpServer::reConnect
                           ((TcpServer *)&p_Var20->__data,
                            (milliseconds)
                            (this->super_NetworkCommsInterface).super_CommsInterface.
                            connectionTimeout.__r);
        if (!bVar10) {
          message_00._M_str = "unable to bind to tcp connection socket";
          message_00._M_len = 0x27;
          iVar11 = 0x27;
          CommsInterface::logError((CommsInterface *)this,message_00);
          gmlc::networking::TcpServer::close((TcpServer *)&p_Var20->__data,iVar11);
          CommsInterface::setRxStatus((CommsInterface *)this,ERRORED);
          CommsInterface::setTxStatus((CommsInterface *)this,ERRORED);
          if (!bVar10) goto LAB_0027209c;
        }
      } while ((*(byte *)((long)p_Var20->__size + 0xf0) & 1) != 0);
    }
    local_108._8_8_ = 0;
    pcStack_f0 = std::
                 _Function_handler<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:159:9)>
                 ::_M_invoke;
    local_f8 = std::
               _Function_handler<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:159:9)>
               ::_M_manager;
    local_108._M_unused._M_object = this;
    std::
    function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
    ::operator=((function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                 *)((long)p_Var20->__size + 0x90),
                (function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                 *)&local_108);
    if (local_f8 != (code *)0x0) {
      (*local_f8)((_Any_data *)&local_108,(_Any_data *)&local_108,__destroy_functor);
    }
    local_128._8_8_ = 0;
    pcStack_110 = std::
                  _Function_handler<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:163:22)>
                  ::_M_invoke;
    local_118 = std::
                _Function_handler<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:163:22)>
                ::_M_manager;
    local_128._M_unused._M_object = this;
    std::function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
    ::operator=((function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
                 *)((long)p_Var20->__size + 0xb0),
                (function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
                 *)&local_128);
    if (local_118 != (code *)0x0) {
      (*local_118)(&local_128,&local_128,3);
    }
    gmlc::networking::TcpServer::start((TcpServer *)&p_Var20->__data);
  }
  else {
    local_4d0 = (__native_type *)0x0;
    p_Var20 = (__native_type *)0x0;
  }
  ActionMessage::ActionMessage(&local_e8,cmd_protocol);
  local_e8.messageID = 299;
  NetworkCommsInterface::getAddress_abi_cxx11_
            ((string *)local_4c8,&this->super_NetworkCommsInterface);
  local_e8.payload.bufferSize = local_4c8._8_8_;
  uVar25 = local_4c8._0_8_;
  if ((byte *)local_4c8._0_8_ == local_e8.payload.heap) {
  }
  else {
    SmallBuffer::reserve(&local_e8.payload,local_4c8._8_8_);
    if ((__native_type *)local_e8.payload.bufferSize != (__native_type *)0x0) {
      memcpy(local_e8.payload.heap,(void *)uVar25,local_e8.payload.bufferSize);
    }
  }
  if ((__native_type *)local_4c8._0_8_ != local_4b8) {
    operator_delete((void *)local_4c8._0_8_,(ulong)(local_4b8[0].__align + 1));
  }
  local_350 = p_Var20;
  ActionMessage::packetize_abi_cxx11_((string *)local_1b8,&local_e8);
  local_338.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_338.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_338.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var20 = (__native_type *)&local_198._M_impl.super__Rb_tree_header;
  local_198._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_198._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_198._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_198._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)p_Var20;
  local_198._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)p_Var20;
  if (this->outgoingConnectionsAllowed == true) {
    p_Var15 = (__native_type *)
              (this->connections).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    p_Var26 = (__native_type *)
              (this->connections).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (p_Var15 != p_Var26) {
      do {
        in_R8 = (__native_type *)0x0;
        p_Var20 = p_Var15;
        gmlc::networking::establishConnection
                  ((networking *)local_4c8,(SocketFactory *)local_258,
                   *(io_context **)(local_348._0_8_ + 0x40),(string *)&p_Var15->__data,
                   (milliseconds)0x0);
        if ((__native_type *)local_4c8._0_8_ != (__native_type *)0x0) {
          local_1d8._8_8_ = (__pthread_internal_list *)0x0;
          pcStack_1c0 = std::
                        _Function_handler<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:159:9)>
                        ::_M_invoke;
          local_1c8 = std::
                      _Function_handler<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:159:9)>
                      ::_M_manager;
          local_1d8._M_unused._M_object = this;
          gmlc::networking::TcpConnection::setDataCall
                    ((TcpConnection *)local_4c8._0_8_,
                     (function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                      *)&local_1d8);
          if ((__pthread_internal_list *)local_1c8 != (__pthread_internal_list *)0x0) {
            (*local_1c8)(&local_1d8,&local_1d8,3);
          }
          local_1f8._M_pod_data[8] = false;
          local_1f8._9_3_ = 0;
          local_1f8._12_4_ = stopped;
          pcStack_1e0 = std::
                        _Function_handler<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:163:22)>
                        ::_M_invoke;
          local_1e8 = std::
                      _Function_handler<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:163:22)>
                      ::_M_manager;
          local_1f8._M_unused._M_object = this;
          gmlc::networking::TcpConnection::setErrorCall
                    ((TcpConnection *)local_4c8._0_8_,
                     (function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
                      *)&local_1f8);
          pvVar22 = extraout_RDX;
          if (local_1e8 != (code *)0x0) {
            (*local_1e8)(&local_1f8,&local_1f8,3);
            pvVar22 = extraout_RDX_00;
          }
          gmlc::networking::TcpConnection::send
                    ((TcpConnection *)local_4c8._0_8_,(int)local_1b8,pvVar22,(size_t)p_Var20,
                     (int)in_R8);
          gmlc::networking::TcpConnection::startReceive((TcpConnection *)local_4c8._0_8_);
          std::
          vector<std::pair<std::__cxx11::string,std::shared_ptr<gmlc::networking::TcpConnection>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<gmlc::networking::TcpConnection>>>>
          ::
          emplace_back<std::__cxx11::string_const&,std::shared_ptr<gmlc::networking::TcpConnection>>
                    ((vector<std::pair<std::__cxx11::string,std::shared_ptr<gmlc::networking::TcpConnection>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<gmlc::networking::TcpConnection>>>>
                      *)(local_348 + 0x10),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &p_Var15->__data,(shared_ptr<gmlc::networking::TcpConnection> *)local_4c8);
        }
        if ((__native_type *)local_4c8._8_8_ != (__native_type *)0x0) {
          CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4c8._8_8_);
        }
        p_Var15 = (__native_type *)&(p_Var15->__data).__list.__next;
      } while (p_Var15 != p_Var26);
    }
  }
  CommsInterface::setRxStatus((CommsInterface *)this,CONNECTED);
  local_3e8.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_3e8.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_380._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_380._M_impl.super__Rb_tree_header._M_header;
  local_380._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_380._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_380._M_impl.super__Rb_tree_header._M_node_count = 0;
  if ((this->super_NetworkCommsInterface).super_CommsInterface.brokerTargetAddress._M_string_length
      != 0) {
    LOCK();
    (this->super_NetworkCommsInterface).hasBroker._M_base._M_i = true;
    UNLOCK();
  }
  local_388 = (__native_type *)
              &(this->super_NetworkCommsInterface).super_CommsInterface.brokerTargetAddress;
  local_380._M_impl.super__Rb_tree_header._M_header._M_right =
       local_380._M_impl.super__Rb_tree_header._M_header._M_left;
  if (((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) != 0) {
    if ((this->super_NetworkCommsInterface).brokerPort < 0) {
      iVar11 = getDefaultPort(0xb);
      (this->super_NetworkCommsInterface).brokerPort = iVar11;
    }
    if (this->outgoingConnectionsAllowed == true) {
      uVar12 = (this->super_NetworkCommsInterface).brokerPort;
      __val = -uVar12;
      if (0 < (int)uVar12) {
        __val = uVar12;
      }
      __len = 1;
      if (9 < __val) {
        uVar24 = (ulong)__val;
        uVar9 = 4;
        do {
          __len = uVar9;
          uVar21 = (uint)uVar24;
          if (uVar21 < 100) {
            __len = __len - 2;
            goto LAB_00270796;
          }
          if (uVar21 < 1000) {
            __len = __len - 1;
            goto LAB_00270796;
          }
          if (uVar21 < 10000) goto LAB_00270796;
          uVar24 = uVar24 / 10000;
          uVar9 = __len + 4;
        } while (99999 < uVar21);
        __len = __len + 1;
      }
LAB_00270796:
      piVar2 = *(io_context **)(local_348._0_8_ + 0x40);
      local_4c8._0_8_ = local_4b8;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4c8,
                   (ulong)(__len + -((int)uVar12 >> 0x1f)),'-');
      in_R8 = (__native_type *)local_4c8;
      CLI::std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)(local_4c8._0_8_ + (ulong)(uint)-((int)uVar12 >> 0x1f)),__len,__val);
      p_Var20 = local_388;
      gmlc::networking::establishConnection
                ((networking *)local_318._M_local_buf,(SocketFactory *)local_258,piVar2,
                 (string *)&local_388->__data,(string *)&in_R8->__data,
                 (milliseconds)
                 (this->super_NetworkCommsInterface).super_CommsInterface.connectionTimeout.__r);
      uVar25 = local_318._8_8_;
      local_3e8.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_318._M_allocated_capacity;
      p_Var15 = local_350;
      _Var6._M_pi = local_3e8.
                    super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      local_318._M_allocated_capacity = 0;
      local_318._8_8_ = (__native_type *)0x0;
      local_3e8.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar25;
      if ((__native_type *)_Var6._M_pi != (__native_type *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var6._M_pi);
      }
      if ((__native_type *)local_318._8_8_ != (__native_type *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_318._8_8_);
      }
      if ((__native_type *)local_4c8._0_8_ != local_4b8) {
        operator_delete((void *)local_4c8._0_8_,(ulong)(local_4b8[0].__align + 1));
      }
      if ((__native_type *)
          local_3e8.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr == (__native_type *)0x0) {
        message_07._M_str = "initial connection to broker timed out";
        message_07._M_len = 0x26;
        iVar11 = 0x26;
        CommsInterface::logError((CommsInterface *)this,message_07);
        if (p_Var15 != (__native_type *)0x0) {
          gmlc::networking::TcpServer::close((TcpServer *)&p_Var15->__data,iVar11);
        }
        CommsInterface::setTxStatus((CommsInterface *)this,ERRORED);
        CommsInterface::setRxStatus((CommsInterface *)this,ERRORED);
        goto LAB_00272035;
      }
      local_148._8_8_ = 0;
      pcStack_130 = std::
                    _Function_handler<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:159:9)>
                    ::_M_invoke;
      local_138 = std::
                  _Function_handler<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:159:9)>
                  ::_M_manager;
      local_148._M_unused._M_object = this;
      gmlc::networking::TcpConnection::setDataCall
                (local_3e8.
                 super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,(function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                         *)&local_148);
      if (local_138 != (code *)0x0) {
        (*local_138)(&local_148,&local_148,3);
      }
      local_168._8_8_ = 0;
      pcStack_150 = std::
                    _Function_handler<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:163:22)>
                    ::_M_invoke;
      local_158 = std::
                  _Function_handler<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:163:22)>
                  ::_M_manager;
      local_168._M_unused._M_object = this;
      gmlc::networking::TcpConnection::setErrorCall
                (local_3e8.
                 super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,(function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
                         *)&local_168);
      pvVar22 = extraout_RDX_01;
      if (local_158 != (code *)0x0) {
        (*local_158)((_Any_data *)&local_168,(_Any_data *)&local_168,__destroy_functor);
        pvVar22 = extraout_RDX_02;
      }
      gmlc::networking::TcpConnection::send
                (local_3e8.
                 super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,(int)local_1b8,pvVar22,(size_t)p_Var20,(int)in_R8);
      gmlc::networking::TcpConnection::startReceive
                (local_3e8.
                 super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
      gmlc::networking::makePortAddress
                ((string *)local_4c8,(string *)&local_388->__data,
                 (this->super_NetworkCommsInterface).brokerPort);
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
                              *)&local_198,(key_type *)local_4c8);
      pmVar14->rid = 0;
      if ((__native_type *)local_4c8._0_8_ != local_4b8) {
        operator_delete((void *)local_4c8._0_8_,(ulong)(local_4b8[0].__align + 1));
      }
    }
  }
  CommsInterface::setTxStatus((CommsInterface *)this,CONNECTED);
  local_3d0 = &(this->super_NetworkCommsInterface).super_CommsInterface.txQueue;
  bVar10 = false;
  do {
    p_Var28 = &local_380._M_impl.super__Rb_tree_header;
    local_318._M_allocated_capacity = 0;
    local_318._8_8_ = (__native_type *)0x9aac0f0000000000;
    local_308._M_head_impl = (io_context *)0x9aac0f0000000000;
    local_2a0 = 0;
    p_Stack_298 = (__native_type *)0x0;
    local_2b0 = 0;
    uStack_2a8 = 0;
    local_2c0 = (element_type *)0x0;
    _Stack_2b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_2f0._32_8_ = (__pthread_internal_list *)0x0;
    uStack_2c8._0_1_ = (__atomic_base<bool>)0x0;
    uStack_2c8._1_7_ = 0;
    local_2f0._16_8_ = 0;
    local_2f0._24_8_ = (__pthread_internal_list *)0x0;
    local_2f0._0_8_ = 0;
    local_2f0._8_8_ = 0;
    local_300._M_head_impl = (work *)0x0;
    lStack_2f8 = 0;
    local_290 = 0x40;
    local_288 = (__native_type *)(local_2f0 + 0x18);
    local_270 = 0;
    uStack_268 = 0;
    local_280 = 0;
    uStack_278 = 0;
    gmlc::containers::
    BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
    ::pop((pair<helics::route_id,_helics::ActionMessage> *)local_4c8,local_3d0);
    uVar4 = local_4c8._0_4_;
    p_Var15 = (__native_type *)(local_4c8 + 8);
    __first._M_node = (_Base_ptr)p_Var15;
    ActionMessage::operator=((ActionMessage *)&local_318,(ActionMessage *)&p_Var15->__data);
    ActionMessage::~ActionMessage((ActionMessage *)&p_Var15->__data);
    ppVar7 = local_338.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    this_00 = local_3e8.
              super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    p_Var15 = (__native_type *)p_Var28;
    bVar23 = bVar10;
    p_Var26 = (__native_type *)local_380._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (((local_318._M_allocated_capacity._0_4_ == -60000) ||
        (local_318._M_allocated_capacity._0_4_ == 60000)) ||
       (local_318._M_allocated_capacity._0_4_ == 0x1000ea60)) {
      if (uVar4 == 0) goto LAB_00270b56;
      if (uVar4 != -1) goto joined_r0x00270af5;
      if ((int)local_318._M_allocated_capacity._4_4_ < 299) {
        if (local_318._M_allocated_capacity._4_4_ == 0xe9) {
          bVar10 = false;
          for (p_Var15 = (__native_type *)
                         local_338.
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              p_Var15 != (__native_type *)ppVar7;
              p_Var15 = (__native_type *)(p_Var15->__size + 0x30)) {
            if ((((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(p_Var15->__data).__list.__next)->
                 _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (p_Stack_298 ==
                (__native_type *)
                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&(p_Var15->__data).__owner)->_M_pi)) {
              if (p_Stack_298 != (__native_type *)0x0) {
                __first._M_node =
                     (_Base_ptr)
                     (((enable_shared_from_this<gmlc::networking::TcpConnection> *)
                      &(p_Var15->__data).__lock)->_M_weak_this).
                     super___weak_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
                iVar11 = bcmp(local_288,__first._M_node,(size_t)p_Stack_298);
                if (iVar11 != 0) goto LAB_00270e7e;
              }
              local_4c8._0_4_ = local_308._M_head_impl._4_4_;
              std::
              _Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>,std::_Select1st<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>>
              ::_M_emplace_unique<helics::route_id,std::shared_ptr<gmlc::networking::TcpConnection>>
                        ((_Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>,std::_Select1st<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>>
                          *)&local_380,(route_id *)local_4c8,
                         (shared_ptr<gmlc::networking::TcpConnection> *)
                         &(p_Var15->__data).__list.__next);
              BVar8 = local_308._M_head_impl._4_4_;
              __first._M_node = (_Base_ptr)p_Var15;
              pmVar14 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
                                      *)&local_198,(key_type *)&p_Var15->__data);
              pmVar14->rid = BVar8;
              bVar10 = true;
            }
LAB_00270e7e:
          }
          if (!bVar10) {
            local_4c8._0_8_ = local_4b8;
            __first._M_node = (_Base_ptr)local_4c8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)__first._M_node,local_288,
                       (long)&(((enable_shared_from_this<gmlc::networking::TcpConnection> *)
                               &(local_288->__data).__lock)->_M_weak_this).
                              super___weak_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr + (long)p_Stack_298);
            iVar17 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
                     ::find(&local_198,(key_type *)__first._M_node);
            if ((__native_type *)local_4c8._0_8_ != local_4b8) {
              __first._M_node = (_Base_ptr)(local_4b8[0].__align + 1);
              operator_delete((void *)local_4c8._0_8_,(ulong)__first._M_node);
            }
            if ((_Rb_tree_header *)iVar17._M_node != &local_198._M_impl.super__Rb_tree_header) {
              if (iVar17._M_node[2]._M_color == _S_red) {
                local_4c8._0_4_ = local_308._M_head_impl._4_4_;
                __first._M_node = (_Base_ptr)local_4c8;
                std::
                _Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>,std::_Select1st<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>>
                ::
                _M_emplace_unique<helics::route_id,std::shared_ptr<gmlc::networking::TcpConnection>&>
                          ((_Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>,std::_Select1st<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>>
                            *)&local_380,(route_id *)__first._M_node,&local_3e8);
              }
              else {
                local_4c8._0_4_ = local_308._M_head_impl._4_4_;
                __args_1 = std::
                           map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                           ::operator[]((map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                                         *)&local_380,(key_type *)(iVar17._M_node + 2));
                __first._M_node = (_Base_ptr)local_4c8;
                std::
                _Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>,std::_Select1st<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>>
                ::
                _M_emplace_unique<helics::route_id,std::shared_ptr<gmlc::networking::TcpConnection>&>
                          ((_Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>,std::_Select1st<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>>
                            *)&local_380,(route_id *)__first._M_node,__args_1);
              }
              bVar10 = true;
            }
          }
          if (!bVar10) {
            if (this->outgoingConnectionsAllowed == true) {
              piVar2 = *(io_context **)(local_348._0_8_ + 0x40);
              local_4c8._0_8_ = local_4b8;
              p_Var20 = (__native_type *)local_4c8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)p_Var20,local_288,
                         (long)&(((enable_shared_from_this<gmlc::networking::TcpConnection> *)
                                 &(local_288->__data).__lock)->_M_weak_this).
                                super___weak_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr + (long)p_Stack_298);
              __first._M_node = (_Base_ptr)local_258;
              in_R8 = (__native_type *)0x0;
              gmlc::networking::establishConnection
                        ((networking *)local_510,(SocketFactory *)__first._M_node,piVar2,
                         (string *)&p_Var20->__data,(milliseconds)0x0);
              if ((__native_type *)local_4c8._0_8_ != local_4b8) {
                __first._M_node = (_Base_ptr)(local_4b8[0].__align + 1);
                operator_delete((void *)local_4c8._0_8_,(ulong)__first._M_node);
              }
              p_Var15 = (__native_type *)local_510._8_8_;
              if ((__native_type *)local_510._0_8_ != (__native_type *)0x0) {
                local_218._8_8_ = 0;
                _Stack_200._M_head_impl =
                     (io_context *)
                     std::
                     _Function_handler<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:159:9)>
                     ::_M_invoke;
                local_208 = std::
                            _Function_handler<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:159:9)>
                            ::_M_manager;
                local_218._0_8_ = this;
                gmlc::networking::TcpConnection::setDataCall
                          ((TcpConnection *)local_510._0_8_,
                           (function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                            *)local_218);
                if (local_208 != (code *)0x0) {
                  (*local_208)(local_218,local_218,3);
                }
                _Stack_230._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                _Stack_220._M_p =
                     (pointer)std::
                              _Function_handler<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:163:22)>
                              ::_M_invoke;
                local_228 = std::
                            _Function_handler<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:163:22)>
                            ::_M_manager;
                local_240._8_8_ = this;
                gmlc::networking::TcpConnection::setErrorCall
                          ((TcpConnection *)local_510._0_8_,
                           (function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
                            *)(local_240 + 8));
                pvVar22 = extraout_RDX_03;
                if (local_228 != (code *)0x0) {
                  (*local_228)((_Any_data *)(local_240 + 8),(_Any_data *)(local_240 + 8),
                               __destroy_functor);
                  pvVar22 = extraout_RDX_04;
                }
                gmlc::networking::TcpConnection::send
                          ((TcpConnection *)local_510._0_8_,(int)local_1b8,pvVar22,(size_t)p_Var20,
                           (int)in_R8);
                gmlc::networking::TcpConnection::startReceive((TcpConnection *)local_510._0_8_);
                local_4c8._0_4_ = local_308._M_head_impl._4_4_;
                __first._M_node = (_Base_ptr)local_4c8;
                std::
                _Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>,std::_Select1st<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>>
                ::
                _M_emplace_unique<helics::route_id,std::shared_ptr<gmlc::networking::TcpConnection>>
                          ((_Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>,std::_Select1st<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>>
                            *)&local_380,(route_id *)__first._M_node,
                           (shared_ptr<gmlc::networking::TcpConnection> *)local_510);
                BVar8 = local_308._M_head_impl._4_4_;
                local_4c8._0_8_ = local_4b8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)__first._M_node,local_288,
                           (long)&(((enable_shared_from_this<gmlc::networking::TcpConnection> *)
                                   &(local_288->__data).__lock)->_M_weak_this).
                                  super___weak_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + (long)p_Stack_298);
                pmVar14 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
                                        *)&local_198,(key_type *)__first._M_node);
                pmVar14->rid = BVar8;
                p_Var15 = (__native_type *)local_510._8_8_;
                if ((__native_type *)local_4c8._0_8_ != local_4b8) {
                  __first._M_node = (_Base_ptr)(local_4b8[0].__align + 1);
                  operator_delete((void *)local_4c8._0_8_,(ulong)__first._M_node);
                  p_Var15 = (__native_type *)local_510._8_8_;
                }
              }
              goto LAB_00271523;
            }
            local_510._0_8_ = local_510 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_510,"outgoing connections not allowed ","");
            local_4f0._0_8_ = local_4f0 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_4f0,local_288,
                       (long)&(((enable_shared_from_this<gmlc::networking::TcpConnection> *)
                               &(local_288->__data).__lock)->_M_weak_this).
                              super___weak_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr + (long)p_Stack_298);
            pcVar16 = (char *)0xf;
            if ((__native_type *)local_510._0_8_ != (__native_type *)(local_510 + 0x10)) {
              pcVar16 = (char *)local_500._0_8_;
            }
            in_R8 = (__native_type *)local_510._8_8_;
            if (pcVar16 < (char *)(local_510._8_8_ + local_4f0._8_8_)) {
              pcVar16 = (char *)0xf;
              if ((__native_type *)local_4f0._0_8_ != (__native_type *)(local_4f0 + 0x10)) {
                pcVar16 = (char *)local_4f0._16_8_;
              }
              if (pcVar16 < (char *)(local_510._8_8_ + local_4f0._8_8_)) goto LAB_00271306;
              pbVar18 = CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_4f0,0,0,(char *)local_510._0_8_,local_510._8_8_);
            }
            else {
LAB_00271306:
              pbVar18 = CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_510,(char *)local_4f0._0_8_,local_4f0._8_8_);
            }
            local_4c8._0_8_ = local_4b8;
            p_Var15 = (__native_type *)(pbVar18->_M_dataplus)._M_p;
            p_Var20 = (__native_type *)&pbVar18->field_2;
            if (p_Var15 == p_Var20) {
              local_4b8[0]._0_8_ = p_Var20->__align;
              local_4b8[0]._8_8_ = *(undefined8 *)((long)&pbVar18->field_2 + 8);
            }
            else {
              local_4b8[0]._0_8_ = p_Var20->__align;
              local_4c8._0_8_ = p_Var15;
            }
            __first._M_node = (_Base_ptr)pbVar18->_M_string_length;
            (pbVar18->_M_dataplus)._M_p = (pointer)p_Var20;
            pbVar18->_M_string_length = 0;
            p_Var20->__size[0] = '\0';
            message_05._M_str = (char *)local_4c8._0_8_;
            message_05._M_len = (size_t)__first._M_node;
            local_4c8._8_8_ = __first._M_node;
            CommsInterface::logWarning((CommsInterface *)this,message_05);
            goto LAB_002713f4;
          }
        }
        else if (local_318._M_allocated_capacity._4_4_ == 0xf4) {
          local_4c8._0_4_ = local_308._M_head_impl._4_4_;
          pVar30 = std::
                   _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                   ::equal_range(&local_380,(key_type *)local_4c8);
          __first._M_node = (_Base_ptr)pVar30.first._M_node;
          std::
          _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
          ::_M_erase_aux(&local_380,__first,(_Base_ptr)pVar30.second._M_node);
        }
        else {
LAB_00270e84:
          message_03._M_str = "unrecognized control command";
          message_03._M_len = 0x1c;
          __first._M_node = (_Base_ptr)0x1c;
          CommsInterface::logWarning((CommsInterface *)this,message_03);
          bVar23 = bVar10;
        }
      }
      else if (local_318._M_allocated_capacity._4_4_ == 299) {
        __first._M_node = (_Base_ptr)local_350;
        if (local_350 != (__native_type *)0x0) {
          gmlc::networking::TcpServer::findSocket((TcpServer *)local_4c8,(int)local_350);
          p_Var26 = local_288;
          p_Var15 = p_Stack_298;
          if ((__native_type *)local_4c8._0_8_ == (__native_type *)0x0) {
            message_04._M_str = "(tcpss) unable to locate socket";
            message_04._M_len = 0x1f;
            __first._M_node = (_Base_ptr)0x1f;
            CommsInterface::logWarning((CommsInterface *)this,message_04);
            p_Var15 = (__native_type *)local_4c8._8_8_;
          }
          else {
            if ((__native_type *)
                local_3e8.
                super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr == (__native_type *)0x0) {
              if (p_Stack_298 ==
                  (__native_type *)
                  (this->super_NetworkCommsInterface).super_CommsInterface.brokerName.
                  _M_string_length) {
                if (p_Stack_298 == (__native_type *)0x0) {
                  bVar10 = true;
                }
                else {
                  __first._M_node =
                       (_Base_ptr)
                       (this->super_NetworkCommsInterface).super_CommsInterface.brokerName.
                       _M_dataplus._M_p;
                  iVar11 = bcmp(local_288,__first._M_node,(size_t)p_Stack_298);
                  bVar10 = iVar11 == 0;
                }
              }
              else {
                bVar10 = false;
              }
              bVar29 = true;
              if (!bVar10) {
                __first._M_node = (_Base_ptr)local_388;
                gmlc::networking::makePortAddress
                          ((string *)local_3a8,(string *)&local_388->__data,
                           (this->super_NetworkCommsInterface).brokerPort);
                if (p_Var15 == (__native_type *)local_3a8._8_8_) {
                  if (p_Var15 != (__native_type *)0x0) {
                    __first._M_node = (_Base_ptr)local_3a8._0_8_;
                    iVar11 = bcmp(p_Var26,(void *)local_3a8._0_8_,(size_t)p_Var15);
                    bVar29 = iVar11 == 0;
                  }
                }
                else {
                  bVar29 = false;
                }
              }
              if ((!bVar10) &&
                 ((__native_type *)local_3a8._0_8_ != (__native_type *)(local_3a8 + 0x10))) {
                __first._M_node = (_Base_ptr)(local_3a8._16_8_ + 1);
                operator_delete((void *)local_3a8._0_8_,(ulong)__first._M_node);
              }
              _Var6._M_pi = local_3e8.
                            super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi;
              uVar5 = local_4c8._8_8_;
              uVar25 = local_4c8._0_8_;
              if (bVar29) {
                local_4c8._0_8_ = (__native_type *)0x0;
                local_4c8._8_8_ = (__native_type *)0x0;
                local_3e8.
                super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)uVar25;
                local_3e8.
                super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
                p_Var15 = (__native_type *)local_4c8._8_8_;
                if ((__native_type *)_Var6._M_pi != (__native_type *)0x0) {
                  CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var6._M_pi);
                  p_Var15 = (__native_type *)local_4c8._8_8_;
                }
                goto LAB_00271523;
              }
            }
            p_Var15 = (__native_type *)local_4c8._8_8_;
            if ((__native_type *)local_4c8._0_8_ != (__native_type *)0x0) {
              local_510._0_8_ = p_Stack_298;
              local_510._8_8_ = local_288;
              __first._M_node = (_Base_ptr)local_510;
              p_Var20 = local_288;
              std::
              vector<std::pair<std::__cxx11::string,std::shared_ptr<gmlc::networking::TcpConnection>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<gmlc::networking::TcpConnection>>>>
              ::
              emplace_back<std::basic_string_view<char,std::char_traits<char>>,std::shared_ptr<gmlc::networking::TcpConnection>>
                        ((vector<std::pair<std::__cxx11::string,std::shared_ptr<gmlc::networking::TcpConnection>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<gmlc::networking::TcpConnection>>>>
                          *)(local_348 + 0x10),
                         (basic_string_view<char,_std::char_traits<char>_> *)__first._M_node,
                         (shared_ptr<gmlc::networking::TcpConnection> *)local_4c8);
              p_Var15 = (__native_type *)local_4c8._8_8_;
            }
          }
LAB_00271523:
          if (p_Var15 != (__native_type *)0x0) {
            CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&p_Var15->__data);
          }
        }
      }
      else {
        bVar23 = true;
        if (local_318._M_allocated_capacity._4_4_ != 0x9db) {
          if (local_318._M_allocated_capacity._4_4_ != 0x16570bf) goto LAB_00270e84;
          __first._M_node = (_Base_ptr)0x2;
          CommsInterface::setRxStatus((CommsInterface *)this,TERMINATED);
          bVar23 = bVar10;
        }
      }
    }
    else if (uVar4 == 0) {
LAB_00270b56:
      if ((((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) != 0) &&
         ((__native_type *)
          local_3e8.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (__native_type *)0x0)) {
        __first._M_node = (_Base_ptr)local_4c8;
        ActionMessage::packetize_abi_cxx11_((string *)__first._M_node,(ActionMessage *)&local_318);
        gmlc::networking::TcpConnection::send
                  (this_00,(int)__first._M_node,__buf_00,(size_t)p_Var20,(int)in_R8);
        goto LAB_00270c3c;
      }
      local_510._0_8_ = local_510 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_510,"(tcpss) no route to broker for message, message dropped :","")
      ;
      pcVar16 = actionMessageType(in_stack_fffffffffffffadc);
      pbVar18 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_510,pcVar16);
      local_4c8._0_8_ = local_4b8;
      p_Var15 = (__native_type *)(pbVar18->_M_dataplus)._M_p;
      p_Var20 = (__native_type *)&pbVar18->field_2;
      if (p_Var15 == p_Var20) {
        local_4b8[0]._0_8_ = p_Var20->__align;
        local_4b8[0]._8_8_ = *(undefined8 *)((long)&pbVar18->field_2 + 8);
      }
      else {
        local_4b8[0]._0_8_ = p_Var20->__align;
        local_4c8._0_8_ = p_Var15;
      }
      __first._M_node = (_Base_ptr)pbVar18->_M_string_length;
      (pbVar18->_M_dataplus)._M_p = (pointer)p_Var20;
      pbVar18->_M_string_length = 0;
      (pbVar18->field_2)._M_local_buf[0] = '\0';
      message_02._M_str = (char *)local_4c8._0_8_;
      message_02._M_len = (size_t)__first._M_node;
      local_4c8._8_8_ = __first._M_node;
      CommsInterface::logWarning((CommsInterface *)this,message_02);
      uVar25 = local_4b8[0].__align;
      p_Var15 = (__native_type *)local_4c8._0_8_;
      if ((__native_type *)local_4c8._0_8_ != local_4b8) {
LAB_00270ce2:
        __first._M_node = (_Base_ptr)(uVar25 + 1);
        operator_delete(p_Var15,(ulong)__first._M_node);
      }
LAB_00270cea:
      uVar25 = local_500._0_8_;
      p_Var15 = (__native_type *)local_510._0_8_;
      if ((__native_type *)local_510._0_8_ != (__native_type *)(local_510 + 0x10))
      goto LAB_00270cfe;
    }
    else {
joined_r0x00270af5:
      for (; p_Var26 != (__native_type *)0x0;
          p_Var26 = *(__native_type **)
                     ((long)&(p_Var26->__data).__kind + (ulong)(iVar11 < (int)uVar4) * 8)) {
        iVar11 = *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                          &(p_Var26->__data).__list.__next)->_M_pi;
        if ((int)uVar4 <= iVar11) {
          p_Var15 = p_Var26;
        }
      }
      p_Var20 = (__native_type *)p_Var28;
      if ((p_Var15 != (__native_type *)p_Var28) &&
         (p_Var20 = p_Var15,
         (int)uVar4 <
         *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(p_Var15->__data).__list.__next)->
                  _M_pi)) {
        p_Var20 = (__native_type *)p_Var28;
      }
      if (p_Var20 == (__native_type *)p_Var28) {
        if (((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) == 0) {
          if ((int)local_318._0_4_ < 0x87) {
            uVar12 = local_318._M_allocated_capacity._0_4_ + 3;
            if ((0x26 < uVar12) ||
               ((p_Var20 = (__native_type *)0x600001fe1,
                (0x600001fe1U >> ((ulong)uVar12 & 0x3f) & 1) == 0 &&
                (((ulong)uVar12 != 0x26 || (lStack_2f8 != 0x7fffffffffffffff)))))) {
LAB_00270ee2:
              local_510._0_8_ = local_510 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_510,"(tcpss) unknown message destination message dropped ",
                         "");
              prettyPrintString_abi_cxx11_
                        ((string *)local_4f0,(helics *)local_318._M_local_buf,command);
              pcVar16 = (char *)0xf;
              if ((__native_type *)local_510._0_8_ != (__native_type *)(local_510 + 0x10)) {
                pcVar16 = (char *)local_500._0_8_;
              }
              in_R8 = (__native_type *)local_510._8_8_;
              if (pcVar16 < (char *)(local_510._8_8_ + local_4f0._8_8_)) {
                pcVar16 = (char *)0xf;
                if ((__native_type *)local_4f0._0_8_ != (__native_type *)(local_4f0 + 0x10)) {
                  pcVar16 = (char *)local_4f0._16_8_;
                }
                if (pcVar16 < (char *)(local_510._8_8_ + local_4f0._8_8_)) goto LAB_00270f61;
                pbVar18 = CLI::std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_4f0,0,0,(char *)local_510._0_8_,local_510._8_8_);
              }
              else {
LAB_00270f61:
                pbVar18 = CLI::std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                          _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_510,(char *)local_4f0._0_8_,local_4f0._8_8_);
              }
              local_4c8._0_8_ = local_4b8;
              p_Var15 = (__native_type *)(pbVar18->_M_dataplus)._M_p;
              p_Var20 = (__native_type *)&pbVar18->field_2;
              if (p_Var15 == p_Var20) {
                local_4b8[0]._0_8_ = p_Var20->__align;
                local_4b8[0]._8_8_ = *(undefined8 *)((long)&pbVar18->field_2 + 8);
              }
              else {
                local_4b8[0]._0_8_ = p_Var20->__align;
                local_4c8._0_8_ = p_Var15;
              }
              __first._M_node = (_Base_ptr)pbVar18->_M_string_length;
              (pbVar18->_M_dataplus)._M_p = (pointer)p_Var20;
              pbVar18->_M_string_length = 0;
              p_Var20->__size[0] = '\0';
              message_06._M_str = (char *)local_4c8._0_8_;
              message_06._M_len = (size_t)__first._M_node;
              local_4c8._8_8_ = __first._M_node;
              CommsInterface::logWarning((CommsInterface *)this,message_06);
LAB_002713f4:
              if ((__native_type *)local_4c8._0_8_ != local_4b8) {
                __first._M_node = (_Base_ptr)(local_4b8[0].__align + 1);
                operator_delete((void *)local_4c8._0_8_,(ulong)__first._M_node);
              }
              uVar25 = local_4f0._16_8_;
              p_Var15 = (__native_type *)local_4f0._0_8_;
              if ((__native_type *)local_4f0._0_8_ != (__native_type *)(local_4f0 + 0x10))
              goto LAB_00270ce2;
              goto LAB_00270cea;
            }
          }
          else {
            uVar12 = local_318._M_allocated_capacity._0_4_ - 0x3ee;
            p_Var20 = (__native_type *)(ulong)uVar12;
            if ((((3 < uVar12) || (uVar12 == 1)) && (local_318._M_allocated_capacity._0_4_ != 0x87))
               && (local_318._M_allocated_capacity._0_4_ != 0x89)) goto LAB_00270ee2;
          }
          goto LAB_00270d08;
        }
        __first._M_node = (_Base_ptr)local_4c8;
        ActionMessage::packetize_abi_cxx11_((string *)__first._M_node,(ActionMessage *)&local_318);
        gmlc::networking::TcpConnection::send
                  (this_00,(int)__first._M_node,__buf_01,(size_t)p_Var20,(int)in_R8);
      }
      else {
        pTVar3 = (TcpConnection *)((Time *)(p_Var20->__size + 0x28))->internalTimeCode;
        __first._M_node = (_Base_ptr)local_4c8;
        ActionMessage::packetize_abi_cxx11_((string *)__first._M_node,(ActionMessage *)&local_318);
        gmlc::networking::TcpConnection::send
                  (pTVar3,(int)__first._M_node,__buf,(size_t)p_Var20,(int)in_R8);
      }
LAB_00270c3c:
      uVar25 = local_4b8[0].__align;
      p_Var15 = (__native_type *)local_4c8._0_8_;
      if ((__native_type *)local_4c8._0_8_ != local_4b8) {
LAB_00270cfe:
        __first._M_node = (_Base_ptr)(uVar25 + 1);
        operator_delete(p_Var15,(ulong)__first._M_node);
      }
    }
LAB_00270d08:
    ActionMessage::~ActionMessage((ActionMessage *)&local_318);
    ppVar7 = local_338.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    this_01 = local_350;
    bVar10 = bVar23;
    p_Var15 = (__native_type *)
              local_338.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    p_Var26 = (__native_type *)
              local_338.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  } while (!bVar23);
  for (; local_338.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var26,
      p_Var15 != (__native_type *)ppVar7; p_Var15 = (__native_type *)(p_Var15->__size + 0x30)) {
    pTVar3 = (TcpConnection *)
             ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(p_Var15->__data).__list.__next)->_M_pi
    ;
    if (pTVar3 != (TcpConnection *)0x0) {
      gmlc::networking::TcpConnection::close(pTVar3,(int)__first._M_node);
    }
    p_Var26 = (__native_type *)
              local_338.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  ::_M_erase_at_end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                     *)(local_348 + 0x10),(pointer)&p_Var26->__data);
  iVar11 = (int)p_Var26;
  p_Var19 = local_380._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)p_Var19 != &local_380._M_impl.super__Rb_tree_header) {
    if ((TcpConnection *)p_Var19[1]._M_parent != (TcpConnection *)0x0) {
      gmlc::networking::TcpConnection::close((TcpConnection *)p_Var19[1]._M_parent,(int)p_Var26);
    }
    p_Var19 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var19);
    iVar11 = (int)p_Var26;
  }
  if ((__native_type *)
      local_3e8.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (__native_type *)0x0) {
    gmlc::networking::TcpConnection::close
              (local_3e8.
               super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,iVar11);
  }
  std::
  _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  ::clear(&local_380);
  _Var6._M_pi = local_3e8.
                super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  local_3e8.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_3e8.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((__native_type *)_Var6._M_pi != (__native_type *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var6._M_pi);
  }
  CommsInterface::setTxStatus((CommsInterface *)this,TERMINATED);
  if (this_01 != (__native_type *)0x0) {
    local_4c8._0_8_ = (__native_type *)0x0;
    local_4c8._8_8_ = (__native_type *)0x2faf080;
    do {
      ptVar27 = (timespec *)local_4c8;
      iVar11 = nanosleep((timespec *)local_4c8,(timespec *)local_4c8);
      __fd = (int)ptVar27;
      if (iVar11 != -1) break;
      piVar13 = __errno_location();
    } while (*piVar13 == 4);
    gmlc::networking::TcpServer::close((TcpServer *)&this_01->__data,__fd);
    if (local_4d0 != (__native_type *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_4d0->__data);
    }
    local_4d0 = (__native_type *)0x0;
  }
  if ((this->super_NetworkCommsInterface).super_CommsInterface.rxStatus._M_i == CONNECTED) {
    CommsInterface::setRxStatus((CommsInterface *)this,TERMINATED);
  }
LAB_00272035:
  std::
  _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  ::~_Rb_tree(&local_380);
  if ((__native_type *)
      local_3e8.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (__native_type *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_3e8.
               super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
  ::~_Rb_tree(&local_198);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
             *)(local_348 + 0x10));
  if ((element_type *)local_1b8._0_8_ != (element_type *)(local_1b8 + 0x10)) {
    operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
  }
  ActionMessage::~ActionMessage(&local_e8);
LAB_0027209c:
  std::
  unique_ptr<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
  ::~unique_ptr((unique_ptr<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
                 *)local_240);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = (_Atomic_word *)(local_258._8_8_ + 0xc);
      iVar11 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar11 = *(_Atomic_word *)(local_258._8_8_ + 0xc);
      *(int *)(local_258._8_8_ + 0xc) = iVar11 + -1;
    }
    if (iVar11 == 1) {
      (**(code **)(*(long *)local_258._8_8_ + 0x18))();
    }
  }
  if ((element_type *)local_348._8_8_ != (element_type *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._8_8_);
  }
  if (local_4d0 != (__native_type *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_4d0->__data);
  }
  return;
}

Assistant:

void TcpCommsSS::queue_tx_function()
{
    if (serverMode && (PortNumber < 0)) {
        PortNumber = getDefaultBrokerPort();
    }
    if (!serverMode && !outgoingConnectionsAllowed) {
        logError("no server and no outgoing connections-> no way to connect to comms");
        setRxStatus(ConnectionStatus::ERRORED);
        setTxStatus(ConnectionStatus::ERRORED);
        return;
    }
    gmlc::networking::TcpServer::pointer server;
    auto ioctx = gmlc::networking::AsioContextManager::getContextPointer();
    auto sf = encrypted ? gmlc::networking::SocketFactory(encryption_config) :
                          gmlc::networking::SocketFactory();
    auto contextLoop = ioctx->startContextLoop();
    auto dataCall =
        [this](const TcpConnection::pointer& connection, const char* data, size_t datasize) {
            return dataReceive(connection.get(), data, datasize);
        };
    CommsInterface* ci = this;
    auto errorCall = [ci](const TcpConnection::pointer& connection, const std::error_code& error) {
        return commErrorHandler(ci, connection.get(), error);
    };

    if (serverMode) {
        server = gmlc::networking::TcpServer::create(sf,
                                                     ioctx->getBaseContext(),
                                                     localTargetAddress,
                                                     static_cast<uint16_t>(PortNumber.load()),
                                                     true,
                                                     maxMessageSize);
        while (!server->isReady()) {
            logWarning("retrying tcp bind");
            std::this_thread::sleep_for(std::chrono::milliseconds(150));
            auto connected = server->reConnect(connectionTimeout);
            if (!connected) {
                logError("unable to bind to tcp connection socket");
                server->close();
                setRxStatus(ConnectionStatus::ERRORED);
                setTxStatus(ConnectionStatus::ERRORED);
                return;
            }
        }
        server->setDataCall(dataCall);
        server->setErrorCall(errorCall);
        server->start();
    }

    // generate a local protocol connection string
    ActionMessage cmessage(CMD_PROTOCOL);
    cmessage.messageID = CONNECTION_INFORMATION;
    cmessage.payload = getAddress();
    auto cstring = cmessage.packetize();

    std::vector<std::pair<std::string, TcpConnection::pointer>> made_connections;
    std::map<std::string, route_id> established_routes;
    if (outgoingConnectionsAllowed) {
        for (const auto& conn : connections) {
            try {
                auto new_connect =
                    gmlc::networking::establishConnection(sf, ioctx->getBaseContext(), conn);

                if (new_connect) {
                    new_connect->setDataCall(dataCall);
                    new_connect->setErrorCall(errorCall);
                    new_connect->send(cstring);
                    new_connect->startReceive();

                    made_connections.emplace_back(conn, std::move(new_connect));
                }
            }
            catch (const std::exception& e) {
                logWarning(std::string("unable to establish connection with ") + conn +
                           "::" + e.what());
            }
        }
    }
    setRxStatus(ConnectionStatus::CONNECTED);
    std::vector<char> buffer;

    TcpConnection::pointer brokerConnection;

    std::map<route_id, TcpConnection::pointer> routes;  // for all the other possible routes
    if (!brokerTargetAddress.empty()) {
        hasBroker = true;
    }
    if (hasBroker) {
        if (brokerPort < 0) {
            brokerPort = getDefaultBrokerPort();
        }
        if (outgoingConnectionsAllowed) {
            try {
                brokerConnection = gmlc::networking::establishConnection(sf,
                                                                         ioctx->getBaseContext(),
                                                                         brokerTargetAddress,
                                                                         std::to_string(brokerPort),
                                                                         std::chrono::milliseconds(
                                                                             connectionTimeout));
                if (!brokerConnection) {
                    logError("initial connection to broker timed out");

                    if (server) {
                        server->close();
                    }
                    setTxStatus(ConnectionStatus::ERRORED);
                    setRxStatus(ConnectionStatus::ERRORED);
                    return;
                }

                brokerConnection->setDataCall(dataCall);
                brokerConnection->setErrorCall(errorCall);

                brokerConnection->send(cstring);
                brokerConnection->startReceive();
            }
            catch (std::exception& e) {
                logError(std::string("unable to establish connection with ") + brokerTargetAddress +
                         "::" + e.what());
                setTxStatus(ConnectionStatus::ERRORED);
                setRxStatus(ConnectionStatus::ERRORED);
                return;
            }
            established_routes[gmlc::networking::makePortAddress(brokerTargetAddress, brokerPort)] =
                parent_route_id;
        }
    }

    setTxStatus(ConnectionStatus::CONNECTED);

    bool haltLoop{false};
    //  std::vector<ActionMessage> txlist;
    while (!haltLoop) {
        route_id rid;
        ActionMessage cmd;

        std::tie(rid, cmd) = txQueue.pop();
        bool processed = false;
        if (isProtocolCommand(cmd)) {
            if (rid == control_route) {
                processed = true;
                switch (cmd.messageID) {
                    case CONNECTION_INFORMATION:
                        if (server) {
                            auto conn = server->findSocket(cmd.getExtraData());
                            if (conn) {
                                if (!brokerConnection) {  // check if the connection matches the
                                                          // broker
                                    if ((cmd.payload.to_string() == brokerName) ||
                                        (cmd.payload.to_string() ==
                                         gmlc::networking::makePortAddress(brokerTargetAddress,
                                                                           brokerPort))) {
                                        brokerConnection = std::move(conn);
                                        break;
                                    }
                                }
                                if (conn) {
                                    made_connections.emplace_back(cmd.payload.to_string(),
                                                                  std::move(conn));
                                }
                            } else {
                                logWarning("(tcpss) unable to locate socket");
                            }
                        }
                        break;
                    case NEW_ROUTE: {
                        bool established = false;

                        for (auto& mc : made_connections) {
                            if ((mc.second) && (cmd.payload.to_string() == mc.first)) {
                                routes.emplace(route_id{cmd.getExtraData()}, std::move(mc.second));
                                established = true;
                                established_routes[mc.first] = route_id{cmd.getExtraData()};
                            }
                        }
                        if (!established) {
                            auto efind =
                                established_routes.find(std::string(cmd.payload.to_string()));
                            if (efind != established_routes.end()) {
                                established = true;
                                if (efind->second == parent_route_id) {
                                    routes.emplace(route_id{cmd.getExtraData()}, brokerConnection);
                                } else {
                                    routes.emplace(route_id{cmd.getExtraData()},
                                                   routes[efind->second]);
                                }
                            }
                        }

                        if (!established) {
                            if (outgoingConnectionsAllowed) {
                                try {
                                    auto new_connect = gmlc::networking::establishConnection(
                                        sf,
                                        ioctx->getBaseContext(),
                                        std::string(cmd.payload.to_string()));
                                    if (new_connect) {
                                        new_connect->setDataCall(dataCall);
                                        new_connect->setErrorCall(errorCall);
                                        new_connect->send(cstring);
                                        new_connect->startReceive();
                                        routes.emplace(route_id{cmd.getExtraData()},
                                                       std::move(new_connect));
                                        established_routes[std::string(cmd.payload.to_string())] =
                                            route_id{cmd.getExtraData()};
                                    }
                                }
                                catch (const std::exception& e) {
                                    logWarning(std::string("unable to establish connection with ") +
                                               std::string(cmd.payload.to_string()) +
                                               "::" + e.what());
                                }
                            } else {
                                logWarning(std::string("outgoing connections not allowed ") +
                                           std::string(cmd.payload.to_string()));
                            }
                        }
                    } break;
                    case REMOVE_ROUTE:
                        routes.erase(route_id{cmd.getExtraData()});
                        processed = true;
                        break;
                    case CLOSE_RECEIVER:
                        setRxStatus(ConnectionStatus::TERMINATED);
                        break;
                    case DISCONNECT:
                        haltLoop = true;
                        continue;
                    default:
                        logWarning("unrecognized control command");
                        break;
                }
            }
        }
        if (processed) {
            continue;
        }

        if (rid == parent_route_id) {
            if ((hasBroker) && (brokerConnection)) {
                try {
                    brokerConnection->send(cmd.packetize());
                }
                catch (const std::system_error& se) {
                    if (se.code() != asio::error::connection_aborted) {
                        if (!isDisconnectCommand(cmd)) {
                            logError(std::string("broker send 0 ") +
                                     actionMessageType(cmd.action()) + ':' + se.what());
                        }
                    }
                }
            } else {
                logWarning(
                    std::string("(tcpss) no route to broker for message, message dropped :") +
                    actionMessageType(cmd.action()));
            }
        } else {
            //  txlist.push_back(cmd);
            auto rt_find = routes.find(rid);
            if (rt_find != routes.end()) {
                try {
                    rt_find->second->send(cmd.packetize());
                }
                catch (const std::system_error& se) {
                    if (se.code() != asio::error::connection_aborted) {
                        if (!isDisconnectCommand(cmd)) {
                            logError(std::string("rt send ") + std::to_string(rid.baseValue()) +
                                     "::" + se.what());
                        }
                    }
                }
            } else {
                if (hasBroker) {
                    try {
                        brokerConnection->send(cmd.packetize());
                    }
                    catch (const std::system_error& se) {
                        if (se.code() != asio::error::connection_aborted) {
                            if (!isDisconnectCommand(cmd)) {
                                logError(std::string("broker send ") +
                                         std::to_string(rid.baseValue()) + " ::" + se.what());
                            }
                        }
                    }
                } else {
                    if (!isDisconnectCommand(cmd)) {
                        logWarning(
                            std::string("(tcpss) unknown message destination message dropped ") +
                            prettyPrintString(cmd));
                    }
                }
            }
        }
    }  // while (!haltLoop)

    for (auto& rt : made_connections) {
        if (rt.second) {
            rt.second->close();
        }
    }
    made_connections.clear();
    for (auto& rt : routes) {
        if (rt.second) {
            rt.second->close();
        }
    }
    if (brokerConnection) {
        brokerConnection->close();
    }
    routes.clear();
    brokerConnection = nullptr;
    setTxStatus(ConnectionStatus::TERMINATED);
    if (server) {
        std::this_thread::sleep_for(std::chrono::milliseconds(50));
        server->close();
        server = nullptr;
    }
    if (getRxStatus() == ConnectionStatus::CONNECTED) {
        setRxStatus(ConnectionStatus::TERMINATED);
    }
}